

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

void __thiscall CCheckQueue<FakeCheck>::~CCheckQueue(CCheckQueue<FakeCheck> *this)

{
  long lVar1;
  void *pvVar2;
  thread *t;
  long lVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  this[0xd0] = (CCheckQueue<FakeCheck>)0x1;
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  std::condition_variable::notify_all();
  lVar1 = *(long *)(this + 0xc0);
  for (lVar3 = *(long *)(this + 0xb8); lVar3 != lVar1; lVar3 = lVar3 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)(this + 0xb8));
  pvVar2 = *(void **)(this + 0x88);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)(this + 0x98) - (long)pvVar2);
  }
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x58));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x28));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueue()
    {
        WITH_LOCK(m_mutex, m_request_stop = true);
        m_worker_cv.notify_all();
        for (std::thread& t : m_worker_threads) {
            t.join();
        }
    }